

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O0

bool __thiscall RTIMUMagCal::magCalSaveCorr(RTIMUMagCal *this,char *ellipsoidFitPath)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  RTVector3 local_94;
  undefined1 local_88 [4];
  undefined1 auStack_84 [4];
  float b [9];
  float a [3];
  char *corrFile;
  FILE *file;
  char *ellipsoidFitPath_local;
  RTIMUMagCal *this_local;
  
  if (ellipsoidFitPath == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    sVar2 = strlen(ellipsoidFitPath);
    a._4_8_ = malloc(sVar2 + 0xd);
    sprintf((char *)a._4_8_,"%s/%s",ellipsoidFitPath,"magCorr.dta");
    __stream = fopen((char *)a._4_8_,"r");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"Failed to open ellipsoid fit correction data file\n");
      this_local._7_1_ = false;
    }
    else {
      iVar1 = __isoc99_fscanf(__stream,"%f %f %f %f %f %f %f %f %f %f %f %f",b + 7,b + 8,a,local_88,
                              auStack_84,b,b + 1,b + 2,b + 3,b + 4,b + 5,b + 6);
      if (iVar1 == 0xc) {
        fclose(__stream);
        this->m_settings->m_compassCalEllipsoidValid = true;
        RTVector3::RTVector3(&local_94,b[7],b[8],a[0]);
        RTVector3::operator=(&this->m_settings->m_compassCalEllipsoidOffset,&local_94);
        memcpy(this->m_settings->m_compassCalEllipsoidCorr,local_88,0x24);
        (*(this->m_settings->super_RTIMUHal)._vptr_RTIMUHal[3])();
        this_local._7_1_ = true;
      }
      else {
        fprintf(_stderr,"Ellipsoid corrcetion file didn\'t have 12 floats\n");
        fclose(__stream);
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUMagCal::magCalSaveCorr(const char *ellipsoidFitPath)
{
    FILE *file;
    char *corrFile;
    float a[3];
    float b[9];

    if (ellipsoidFitPath != NULL) {
        corrFile = (char *)malloc(strlen(RTIMUCALDEFS_MAG_CORR_FILE) + strlen(ellipsoidFitPath) + 2);
        sprintf(corrFile, "%s/%s", ellipsoidFitPath, RTIMUCALDEFS_MAG_CORR_FILE);
        if ((file = fopen(corrFile, "r")) == NULL) {
            HAL_ERROR("Failed to open ellipsoid fit correction data file\n");
            return false;
        }
        if (fscanf(file, "%f %f %f %f %f %f %f %f %f %f %f %f",
            a + 0, a + 1, a + 2, b + 0, b + 1, b + 2, b + 3, b + 4, b + 5, b + 6, b + 7, b + 8) != 12) {
            HAL_ERROR("Ellipsoid corrcetion file didn't have 12 floats\n");
            fclose(file);
            return false;
        }
        fclose(file);
        m_settings->m_compassCalEllipsoidValid = true;
        m_settings->m_compassCalEllipsoidOffset = RTVector3(a[0], a[1], a[2]);
        memcpy(m_settings->m_compassCalEllipsoidCorr, b, 9 * sizeof(float));
        m_settings->saveSettings();
        return true;
    }
    return false;
}